

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::InitializeUpdateData<duckdb::string_t>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,SelectionVector *sel)

{
  uint uVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  undefined8 uVar5;
  uint uVar6;
  undefined8 *puVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  anon_union_16_2_67f50693_for_value aVar11;
  anon_union_16_2_67f50693_for_value local_40;
  
  uVar6 = update_info->N;
  if ((ulong)uVar6 != 0) {
    pdVar2 = update->data;
    puVar7 = (undefined8 *)((long)&update_info[1].segment + (ulong)update_info->max * 4);
    uVar9 = 0;
    do {
      uVar10 = uVar9;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)sel->sel_vector[uVar9];
      }
      psVar3 = update->sel->sel_vector;
      if (psVar3 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar3[uVar10];
      }
      uVar5 = *(undefined8 *)(pdVar2 + uVar10 * 0x10 + 8);
      *puVar7 = *(undefined8 *)(pdVar2 + uVar10 * 0x10);
      puVar7[1] = uVar5;
      uVar9 = uVar9 + 1;
      puVar7 = puVar7 + 2;
    } while (uVar6 != uVar9);
  }
  pdVar2 = base_data->data;
  FlatVector::VerifyFlatVector(base_data);
  uVar6 = base_info->N;
  if (uVar6 != 0) {
    puVar7 = (undefined8 *)((long)&base_info[1].column_index + (ulong)base_info->max * 4);
    uVar9 = 0;
    do {
      uVar1 = *(uint *)((long)&base_info[1].segment + uVar9 * 4);
      puVar4 = (base_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) ||
         ((puVar4[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
        lVar8 = (ulong)uVar1 * 0x10;
        local_40._0_8_ = *(undefined8 *)(pdVar2 + lVar8);
        local_40.pointer.ptr = (char *)*(undefined8 *)(pdVar2 + lVar8 + 8);
        aVar11.pointer.ptr = local_40.pointer.ptr;
        aVar11._0_8_ = local_40._0_8_;
        if (0xc < (uint)local_40._0_8_) {
          aVar11.pointer =
               (anon_struct_16_3_d7536bce_for_pointer)
               StringHeap::AddBlob(&base_info->segment->heap,(string_t *)&local_40.pointer);
          uVar6 = base_info->N;
        }
        puVar7[-1] = aVar11._0_8_;
        *puVar7 = aVar11.pointer.ptr;
      }
      uVar9 = uVar9 + 1;
      puVar7 = puVar7 + 2;
    } while (uVar9 < uVar6);
  }
  return;
}

Assistant:

static void InitializeUpdateData(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                                 UnifiedVectorFormat &update, const SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto tuple_data = update_info.GetData<T>();

	for (idx_t i = 0; i < update_info.N; i++) {
		auto idx = update.sel->get_index(sel.get_index(i));
		tuple_data[i] = update_data[idx];
	}

	auto base_array_data = FlatVector::GetData<T>(base_data);
	auto &base_validity = FlatVector::Validity(base_data);
	auto base_tuple_data = base_info.GetData<T>();
	auto base_tuples = base_info.GetTuples();
	for (idx_t i = 0; i < base_info.N; i++) {
		auto base_idx = base_tuples[i];
		if (!base_validity.RowIsValid(base_idx)) {
			continue;
		}
		base_tuple_data[i] = UpdateSelectElement::Operation<T>(*base_info.segment, base_array_data[base_idx]);
	}
}